

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

bool __thiscall ON_PlaneEquation::Transform(ON_PlaneEquation *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  ON_Xform *pOVar7;
  ON_Xform T;
  ON_Xform local_88;
  
  if ((((1.23432101234321e+308 <= ABS(this->x)) || (1.23432101234321e+308 <= ABS(this->y))) ||
      (1.23432101234321e+308 <= ABS(this->z))) || (this->d <= -1.23432101234321e+308)) {
    bVar5 = false;
  }
  else {
    bVar5 = this->d < 1.23432101234321e+308;
  }
  if (bVar5 != false) {
    pOVar7 = &local_88;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(double *)pOVar7 = *(double *)xform;
      xform = (ON_Xform *)((long)xform + 8);
      pOVar7 = (ON_Xform *)((long)pOVar7 + 8);
    }
    bVar5 = ON_Xform::Invert(&local_88,(double *)0x0);
    if (bVar5) {
      dVar1 = this->x;
      dVar2 = this->y;
      dVar3 = this->z;
      dVar4 = this->d;
      this->x = local_88.m_xform[3][0] * dVar4 +
                local_88.m_xform[2][0] * dVar3 +
                local_88.m_xform[0][0] * dVar1 + local_88.m_xform[1][0] * dVar2;
      this->y = local_88.m_xform[3][1] * dVar4 +
                local_88.m_xform[2][1] * dVar3 +
                local_88.m_xform[0][1] * dVar1 + local_88.m_xform[1][1] * dVar2;
      this->z = local_88.m_xform[3][2] * dVar4 +
                local_88.m_xform[2][2] * dVar3 +
                local_88.m_xform[0][2] * dVar1 + local_88.m_xform[1][2] * dVar2;
      this->d = dVar4 * local_88.m_xform[3][3] +
                dVar3 * local_88.m_xform[2][3] +
                dVar1 * local_88.m_xform[0][3] + dVar2 * local_88.m_xform[1][3];
    }
  }
  return bVar5;
}

Assistant:

bool ON_PlaneEquation::Transform( const ON_Xform& xform )
{
  bool rc = IsValid();
  if ( rc )
  {
    // Apply the inverse transpose to the equation parameters
    ON_Xform T(xform);
    rc = T.Invert();
    if ( rc )
    {
      const double xx=x;
      const double yy=y;
      const double zz=z;
      const double dd=d;
      x = T.m_xform[0][0]*xx + T.m_xform[1][0]*yy + T.m_xform[2][0]*zz + T.m_xform[3][0]*dd;
      y = T.m_xform[0][1]*xx + T.m_xform[1][1]*yy + T.m_xform[2][1]*zz + T.m_xform[3][1]*dd;
      z = T.m_xform[0][2]*xx + T.m_xform[1][2]*yy + T.m_xform[2][2]*zz + T.m_xform[3][2]*dd;
      d = T.m_xform[0][3]*xx + T.m_xform[1][3]*yy + T.m_xform[2][3]*zz + T.m_xform[3][3]*dd;
    }
  }
  return rc;
}